

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

BVec4 __thiscall deqp::egl::ConfigFilter::getSpecifiedRGBColors(ConfigFilter *this)

{
  bool *pbVar1;
  ConfigFilter *in_RSI;
  AttribRule AVar2;
  int iStack_40;
  EGLint value;
  EGLenum attrib;
  int ndx;
  EGLenum bitAttribs [4];
  ConfigFilter *this_local;
  BVec4 *result;
  
  _attrib = 0x302300003024;
  bitAttribs[0] = 0x3022;
  bitAttribs[1] = 0x3021;
  tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)this);
  for (value = 0; value < 4; value = value + 1) {
    AVar2 = getAttribute(in_RSI,(&attrib)[value]);
    iStack_40 = AVar2.value;
    if ((iStack_40 == 0) || (iStack_40 == -1)) {
      pbVar1 = tcu::Vector<bool,_4>::operator[]((Vector<bool,_4> *)this,value);
      *pbVar1 = false;
    }
    else {
      pbVar1 = tcu::Vector<bool,_4>::operator[]((Vector<bool,_4> *)this,value);
      *pbVar1 = true;
    }
  }
  return (BVec4)SUB84(this,0);
}

Assistant:

tcu::BVec4 getSpecifiedRGBColors (void) const
	{
		const EGLenum bitAttribs[] =
		{
			EGL_RED_SIZE,
			EGL_GREEN_SIZE,
			EGL_BLUE_SIZE,
			EGL_ALPHA_SIZE
		};

		tcu::BVec4 result;

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bitAttribs); ndx++)
		{
			const EGLenum	attrib	= bitAttribs[ndx];
			const EGLint	value	= getAttribute(attrib).value;

			if (value != 0 && value != EGL_DONT_CARE)
				result[ndx] = true;
			else
				result[ndx] = false;
		}

		return result;
	}